

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnImportTable
          (BinaryReaderInterp *this,Index import_index,string_view module_name,
          string_view field_name,Index table_index,Type elem_type,Limits *elem_limits)

{
  ModuleDesc *pMVar1;
  bool bVar2;
  Result result;
  undefined1 local_128 [8];
  string local_120;
  string local_100;
  ImportType local_e0;
  uint64_t local_98;
  uint64_t local_90;
  undefined8 local_88;
  Enum local_7c;
  undefined1 local_78 [8];
  TableType table_type;
  Index import_index_local;
  BinaryReaderInterp *this_local;
  undefined1 auStack_30 [4];
  Type elem_type_local;
  string_view field_name_local;
  string_view module_name_local;
  
  field_name_local.data_ = (char *)field_name.size_;
  _auStack_30 = field_name.data_;
  module_name_local.data_ = (char *)module_name.size_;
  field_name_local.size_ = (size_type)module_name.data_;
  table_type.limits._20_4_ = elem_type.enum_;
  result = SharedValidator::OnTable
                     (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                      elem_type,elem_limits);
  bVar2 = Failed(result);
  if (bVar2) {
    Result::Result((Result *)((long)&module_name_local.size_ + 4),Error);
  }
  else {
    local_7c = elem_type.enum_;
    local_98 = elem_limits->initial;
    local_90 = elem_limits->max;
    local_88._0_1_ = elem_limits->has_max;
    local_88._1_1_ = elem_limits->is_shared;
    local_88._2_6_ = *(undefined6 *)&elem_limits->field_0x12;
    TableType::TableType((TableType *)local_78,(ValueType)elem_type.enum_,*elem_limits);
    pMVar1 = this->module_;
    string_view::to_string_abi_cxx11_(&local_100,(string_view *)&field_name_local.size_);
    string_view::to_string_abi_cxx11_((string *)(local_128 + 8),(string_view *)auStack_30);
    TableType::Clone((TableType *)local_128);
    ImportType::ImportType
              (&local_e0,&local_100,(string *)(local_128 + 8),
               (unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                *)local_128);
    std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::push_back
              (&pMVar1->imports,(value_type *)&local_e0);
    ImportDesc::~ImportDesc((ImportDesc *)&local_e0);
    std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
    ~unique_ptr((unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                 *)local_128);
    std::__cxx11::string::~string((string *)(local_128 + 8));
    std::__cxx11::string::~string((string *)&local_100);
    std::vector<wabt::interp::TableType,_std::allocator<wabt::interp::TableType>_>::push_back
              (&this->table_types_,(value_type *)local_78);
    Result::Result((Result *)((long)&module_name_local.size_ + 4),Ok);
    TableType::~TableType((TableType *)local_78);
  }
  return (Result)module_name_local.size_._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnImportTable(Index import_index,
                                         string_view module_name,
                                         string_view field_name,
                                         Index table_index,
                                         Type elem_type,
                                         const Limits* elem_limits) {
  CHECK_RESULT(validator_.OnTable(loc, elem_type, *elem_limits));
  TableType table_type{elem_type, *elem_limits};
  module_.imports.push_back(ImportDesc{ImportType(
      module_name.to_string(), field_name.to_string(), table_type.Clone())});
  table_types_.push_back(table_type);
  return Result::Ok;
}